

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_file_stream.cpp
# Opt level: O3

void word_count(int argc,char **argv)

{
  char *__s;
  int iVar1;
  char cVar2;
  long *plVar3;
  ostream *poVar4;
  size_t sVar5;
  ulong uVar6;
  char ch;
  ifstream fin;
  long local_238 [65];
  
  if (argc == 1) {
    std::operator<<((ostream *)&std::cerr,"Usage: ");
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ok, processing...\n",0x12);
  std::ifstream::ifstream(local_238);
  if (1 < argc) {
    uVar6 = 1;
    do {
      __s = argv[uVar6];
      std::ifstream::open((char *)local_238,(_Ios_Openmode)__s);
      cVar2 = std::__basic_file<char>::is_open();
      iVar1 = (int)local_238;
      if (cVar2 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot open ",0xc)
        ;
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x136498);
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
        std::ios::clear((int)*(undefined8 *)(local_238[0] + -0x18) + iVar1);
      }
      else {
        do {
          plVar3 = (long *)std::istream::get((char *)local_238);
        } while ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0);
        poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," characters in ",0xf);
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::ios::clear((int)*(undefined8 *)(local_238[0] + -0x18) + iVar1);
        std::ifstream::close();
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)argc);
  }
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," characters in all files\n",0x19);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void word_count(int argc, char * argv[]) {
    using namespace std;

//    argc = 2;
//    char *f1 = "justify";
//    char *f2 = "number.txt";
//    char *f3 = "tobuy.txt";
//    argv = {
//            &f1,
//    };

    //  no arguments
    if (argc == 1) {
        cerr << "Usage: " << argv[0] << " filenames[s]\n";
        exit(EXIT_FAILURE);
    }
    cout << "ok, processing...\n";
//    getchar();

    ifstream fin;
    long count;
    long total = 0;
    char ch;

    //  iterate through args as filename
    for(int idx = 1; idx < argc; idx++) {
//        auto filename = argv[idx];
        char *filename = argv[idx];

        fin.open(filename);
        if (!fin.is_open()) {
            cerr << "Cannot open " << filename << endl;
            fin.clear();
            continue;
        }
        count = 0;
        //  read file
        while(fin.get(ch)) {
            count++;
        }
        cout << count << " characters in " << filename << endl;
        total += count;
        fin.clear();
        fin.close();
    }

    cout << total << " characters in all files\n";
}